

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::test_run_end(ConsoleReporter *this,TestRunStats *p)

{
  bool bVar1;
  bool bVar2;
  _Setw _Var3;
  uint *puVar4;
  ostream *poVar5;
  int iVar6;
  Enum EVar7;
  double dVar8;
  char *local_c0;
  int numSkipped;
  uint local_34;
  int iStack_30;
  bool anythingFailed;
  uint local_2c;
  int failwidth;
  int local_24;
  uint local_20;
  int passwidth;
  TestRunStats *pTStack_18;
  int totwidth;
  TestRunStats *p_local;
  ConsoleReporter *this_local;
  
  if (((this->opt->minimal & 1U) == 0) || (p->numTestCasesFailed != 0)) {
    pTStack_18 = p;
    p_local = (TestRunStats *)this;
    separator_to_stream(this);
    std::ostream::operator<<(this->s,std::dec);
    local_20 = pTStack_18->numAsserts;
    puVar4 = std::max<unsigned_int>(&pTStack_18->numTestCasesPassingFilters,&local_20);
    dVar8 = log10((double)(*puVar4 + 1));
    dVar8 = ceil(dVar8);
    passwidth = (int)dVar8;
    failwidth = pTStack_18->numTestCasesPassingFilters - pTStack_18->numTestCasesFailed;
    local_2c = pTStack_18->numAsserts - pTStack_18->numAssertsFailed;
    puVar4 = std::max<unsigned_int>((uint *)&failwidth,&local_2c);
    dVar8 = log10((double)(*puVar4 + 1));
    dVar8 = ceil(dVar8);
    local_24 = (int)dVar8;
    local_34 = pTStack_18->numAssertsFailed;
    puVar4 = std::max<unsigned_int>(&pTStack_18->numTestCasesFailed,&local_34);
    dVar8 = log10((double)(*puVar4 + 1));
    dVar8 = ceil(dVar8);
    iStack_30 = (int)dVar8;
    bVar1 = true;
    if (pTStack_18->numTestCasesFailed == 0) {
      bVar1 = 0 < pTStack_18->numAssertsFailed;
    }
    poVar5 = Color::operator<<(this->s,Cyan);
    poVar5 = std::operator<<(poVar5,"[doctest] ");
    poVar5 = Color::operator<<(poVar5,None);
    poVar5 = std::operator<<(poVar5,"test cases: ");
    _Var3 = std::setw(passwidth);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTStack_18->numTestCasesPassingFilters);
    poVar5 = std::operator<<(poVar5," | ");
    bVar2 = true;
    if (pTStack_18->numTestCasesPassingFilters != 0) {
      bVar2 = bVar1;
    }
    EVar7 = Green;
    if (bVar2) {
      EVar7 = None;
    }
    poVar5 = Color::operator<<(poVar5,EVar7);
    _Var3 = std::setw(local_24);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,pTStack_18->numTestCasesPassingFilters -
                               pTStack_18->numTestCasesFailed);
    poVar5 = std::operator<<(poVar5," passed");
    poVar5 = Color::operator<<(poVar5,None);
    poVar5 = std::operator<<(poVar5," | ");
    EVar7 = None;
    if (pTStack_18->numTestCasesFailed != 0) {
      EVar7 = Red;
    }
    poVar5 = Color::operator<<(poVar5,EVar7);
    _Var3 = std::setw(iStack_30);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTStack_18->numTestCasesFailed);
    poVar5 = std::operator<<(poVar5," failed");
    poVar5 = Color::operator<<(poVar5,None);
    std::operator<<(poVar5," |");
    if ((this->opt->no_skipped_summary & 1U) == 0) {
      iVar6 = pTStack_18->numTestCases - pTStack_18->numTestCasesPassingFilters;
      poVar5 = std::operator<<(this->s," ");
      EVar7 = Yellow;
      if (iVar6 == 0) {
        EVar7 = None;
      }
      poVar5 = Color::operator<<(poVar5,EVar7);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
      poVar5 = std::operator<<(poVar5," skipped");
      Color::operator<<(poVar5,None);
    }
    std::operator<<(this->s,"\n");
    poVar5 = Color::operator<<(this->s,Cyan);
    poVar5 = std::operator<<(poVar5,"[doctest] ");
    poVar5 = Color::operator<<(poVar5,None);
    poVar5 = std::operator<<(poVar5,"assertions: ");
    _Var3 = std::setw(passwidth);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTStack_18->numAsserts);
    poVar5 = std::operator<<(poVar5," | ");
    bVar2 = true;
    if (pTStack_18->numAsserts != 0) {
      bVar2 = bVar1;
    }
    EVar7 = Green;
    if (bVar2) {
      EVar7 = None;
    }
    poVar5 = Color::operator<<(poVar5,EVar7);
    _Var3 = std::setw(local_24);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)
             std::ostream::operator<<(poVar5,pTStack_18->numAsserts - pTStack_18->numAssertsFailed);
    poVar5 = std::operator<<(poVar5," passed");
    poVar5 = Color::operator<<(poVar5,None);
    poVar5 = std::operator<<(poVar5," | ");
    EVar7 = None;
    if (0 < pTStack_18->numAssertsFailed) {
      EVar7 = Red;
    }
    poVar5 = Color::operator<<(poVar5,EVar7);
    _Var3 = std::setw(iStack_30);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTStack_18->numAssertsFailed);
    poVar5 = std::operator<<(poVar5," failed");
    poVar5 = Color::operator<<(poVar5,None);
    std::operator<<(poVar5," |\n");
    poVar5 = Color::operator<<(this->s,Cyan);
    poVar5 = std::operator<<(poVar5,"[doctest] ");
    poVar5 = Color::operator<<(poVar5,None);
    poVar5 = std::operator<<(poVar5,"Status: ");
    EVar7 = Green;
    if (pTStack_18->numTestCasesFailed != 0) {
      EVar7 = Red;
    }
    poVar5 = Color::operator<<(poVar5,EVar7);
    if (pTStack_18->numTestCasesFailed == 0) {
      local_c0 = "SUCCESS!";
    }
    else {
      local_c0 = "FAILURE!";
    }
    poVar5 = std::operator<<(poVar5,local_c0);
    poVar5 = Color::operator<<(poVar5,None);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            if(opt.minimal && p.numTestCasesFailed == 0)
                return;

            separator_to_stream();
            s << std::dec;

            auto totwidth = int(std::ceil(log10((std::max(p.numTestCasesPassingFilters, static_cast<unsigned>(p.numAsserts))) + 1)));
            auto passwidth = int(std::ceil(log10((std::max(p.numTestCasesPassingFilters - p.numTestCasesFailed, static_cast<unsigned>(p.numAsserts - p.numAssertsFailed))) + 1)));
            auto failwidth = int(std::ceil(log10((std::max(p.numTestCasesFailed, static_cast<unsigned>(p.numAssertsFailed))) + 1)));
            const bool anythingFailed = p.numTestCasesFailed > 0 || p.numAssertsFailed > 0;
            s << Color::Cyan << "[doctest] " << Color::None << "test cases: " << std::setw(totwidth)
              << p.numTestCasesPassingFilters << " | "
              << ((p.numTestCasesPassingFilters == 0 || anythingFailed) ? Color::None :
                                                                          Color::Green)
              << std::setw(passwidth) << p.numTestCasesPassingFilters - p.numTestCasesFailed << " passed"
              << Color::None << " | " << (p.numTestCasesFailed > 0 ? Color::Red : Color::None)
              << std::setw(failwidth) << p.numTestCasesFailed << " failed" << Color::None << " |";
            if(opt.no_skipped_summary == false) {
                const int numSkipped = p.numTestCases - p.numTestCasesPassingFilters;
                s << " " << (numSkipped == 0 ? Color::None : Color::Yellow) << numSkipped
                  << " skipped" << Color::None;
            }
            s << "\n";
            s << Color::Cyan << "[doctest] " << Color::None << "assertions: " << std::setw(totwidth)
              << p.numAsserts << " | "
              << ((p.numAsserts == 0 || anythingFailed) ? Color::None : Color::Green)
              << std::setw(passwidth) << (p.numAsserts - p.numAssertsFailed) << " passed" << Color::None
              << " | " << (p.numAssertsFailed > 0 ? Color::Red : Color::None) << std::setw(failwidth)
              << p.numAssertsFailed << " failed" << Color::None << " |\n";
            s << Color::Cyan << "[doctest] " << Color::None
              << "Status: " << (p.numTestCasesFailed > 0 ? Color::Red : Color::Green)
              << ((p.numTestCasesFailed > 0) ? "FAILURE!" : "SUCCESS!") << Color::None << std::endl;
        }